

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O0

Constant * __thiscall flow::lang::IRGenerator::getConstant(IRGenerator *this,Expr *expr)

{
  Report *this_00;
  LiteralType args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *literal;
  RegExp *literal_00;
  SourceLocation *sloc;
  LiteralExpr<flow::util::RegExp> *local_98;
  RegExpExpr *local_80;
  allocator<char> local_51;
  string local_50;
  LiteralExpr<flow::util::RegExp> *local_30;
  RegExpExpr *e_1;
  StringExpr *e;
  Expr *expr_local;
  IRGenerator *this_local;
  
  e = (StringExpr *)expr;
  expr_local = (Expr *)this;
  if (expr == (Expr *)0x0) {
    local_80 = (RegExpExpr *)0x0;
  }
  else {
    local_80 = (RegExpExpr *)
               __dynamic_cast(expr,&Expr::typeinfo,&LiteralExpr<std::__cxx11::string>::typeinfo,0);
  }
  e_1 = local_80;
  if (local_80 == (RegExpExpr *)0x0) {
    if (e == (StringExpr *)0x0) {
      local_98 = (LiteralExpr<flow::util::RegExp> *)0x0;
    }
    else {
      local_98 = (LiteralExpr<flow::util::RegExp> *)
                 __dynamic_cast(e,&Expr::typeinfo,&LiteralExpr<flow::util::RegExp>::typeinfo,0);
    }
    local_30 = local_98;
    if (local_98 == (LiteralExpr<flow::util::RegExp> *)0x0) {
      this_00 = this->report_;
      sloc = ASTNode::location((ASTNode *)e);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"FIXME: Invalid (unsupported) literal type <{}> in match case."
                 ,&local_51);
      args = (*(e->super_Expr).super_ASTNode._vptr_ASTNode[3])();
      diagnostics::Report::typeError<flow::LiteralType>(this_00,sloc,&local_50,args);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      this_local = (IRGenerator *)0x0;
    }
    else {
      literal_00 = LiteralExpr<flow::util::RegExp>::value(local_98);
      this_local = (IRGenerator *)IRBuilder::get(&this->super_IRBuilder,literal_00);
    }
  }
  else {
    literal = LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::value((LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_80);
    this_local = (IRGenerator *)IRBuilder::get(&this->super_IRBuilder,literal);
  }
  return (Constant *)this_local;
}

Assistant:

Constant* IRGenerator::getConstant(Expr* expr) {
  if (auto e = dynamic_cast<StringExpr*>(expr))
    return get(e->value());
  else if (auto e = dynamic_cast<RegExpExpr*>(expr))
    return get(e->value());
  else {
    report_->typeError(expr->location(),
                       "FIXME: Invalid (unsupported) literal type <{}> in match case.",
                       expr->getType());
    return nullptr;
  }
}